

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiIO::ImGuiIO(ImGuiIO *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  long lVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  
  (this->DisplaySize).x = 0.0;
  (this->DisplaySize).y = 0.0;
  (this->DisplayFramebufferScale).x = 0.0;
  (this->DisplayFramebufferScale).y = 0.0;
  (this->MousePos).x = 0.0;
  (this->MousePos).y = 0.0;
  (this->MouseDelta).x = 0.0;
  (this->MouseDelta).y = 0.0;
  auVar5 = ZEXT1632(ZEXT816(0) << 0x40);
  (this->MousePosPrev).x = (float)(int)auVar5._0_8_;
  (this->MousePosPrev).y = (float)(int)((ulong)auVar5._0_8_ >> 0x20);
  this->MouseClickedPos[0].x = (float)(int)auVar5._8_8_;
  this->MouseClickedPos[0].y = (float)(int)((ulong)auVar5._8_8_ >> 0x20);
  this->MouseClickedPos[1].x = (float)(int)auVar5._16_8_;
  this->MouseClickedPos[1].y = (float)(int)((ulong)auVar5._16_8_ >> 0x20);
  this->MouseClickedPos[2].x = (float)(int)auVar5._24_8_;
  this->MouseClickedPos[2].y = (float)(int)((ulong)auVar5._24_8_ >> 0x20);
  *(undefined1 (*) [32])(this->MouseClickedPos + 1) = auVar5;
  *(undefined1 (*) [32])this->MouseDragMaxDistanceAbs = ZEXT1632(ZEXT816(0) << 0x40);
  this->MouseDragMaxDistanceAbs[4].x = 0.0;
  this->MouseDragMaxDistanceAbs[4].y = 0.0;
  memset(this,0,0x1558);
  (this->DisplaySize).x = -1.0;
  (this->DisplaySize).y = -1.0;
  this->DeltaTime = 0.016666668;
  this->IniSavingRate = 5.0;
  this->IniFilename = "imgui.ini";
  this->LogFilename = "imgui_log.txt";
  this->MouseDoubleClickTime = 0.3;
  this->MouseDoubleClickMaxDist = 6.0;
  auVar5 = vpcmpeqd_avx2(ZEXT832(0x40c000003e99999a),ZEXT832(0x40c000003e99999a));
  *(undefined1 (*) [32])this->KeyMap = auVar5;
  *(undefined1 (*) [32])(this->KeyMap + 8) = auVar5;
  *(undefined1 (*) [32])(this->KeyMap + 0xe) = auVar5;
  this->KeyRepeatDelay = 0.275;
  this->KeyRepeatRate = 0.05;
  this->UserData = (void *)SUB168(ZEXT816(0) << 0x20,0);
  this->Fonts = (ImFontAtlas *)SUB168(ZEXT816(0) << 0x20,8);
  this->FontGlobalScale = 1.0;
  this->FontDefault = (ImFont *)0x0;
  this->FontAllowUserScaling = false;
  (this->DisplayFramebufferScale).x = 1.0;
  (this->DisplayFramebufferScale).y = 1.0;
  this->MouseDrawCursor = false;
  this->ConfigMacOSXBehaviors = false;
  this->ConfigInputTextCursorBlink = true;
  this->ConfigWindowsResizeFromEdges = true;
  this->ConfigWindowsMoveFromTitleBarOnly = false;
  this->ConfigMemoryCompactTimer = 60.0;
  this->BackendLanguageUserData = (void *)0x0;
  auVar5 = ZEXT832(0) << 0x20;
  this->BackendPlatformName = (char *)auVar5._0_8_;
  this->BackendRendererName = (char *)auVar5._8_8_;
  this->BackendPlatformUserData = (void *)auVar5._16_8_;
  this->BackendRendererUserData = (void *)auVar5._24_8_;
  this->GetClipboardTextFn = GetClipboardTextFn_DefaultImpl;
  this->SetClipboardTextFn = SetClipboardTextFn_DefaultImpl;
  this->ClipboardUserData = (void *)0x0;
  this->ImeSetInputScreenPosFn = ImeSetInputScreenPosFn_DefaultImpl;
  this->ImeWindowHandle = (void *)0x0;
  (this->MousePos).x = -3.4028235e+38;
  (this->MousePos).y = -3.4028235e+38;
  (this->MousePosPrev).x = -3.4028235e+38;
  (this->MousePosPrev).y = -3.4028235e+38;
  this->MouseDragThreshold = 6.0;
  auVar2 = _DAT_001e4d20;
  auVar6._8_4_ = 0xbf800000;
  auVar6._0_8_ = 0xbf800000bf800000;
  auVar6._12_4_ = 0xbf800000;
  auVar6._16_4_ = 0xbf800000;
  auVar6._20_4_ = 0xbf800000;
  auVar6._24_4_ = 0xbf800000;
  auVar6._28_4_ = 0xbf800000;
  auVar5 = vmaskmovps_avx(_DAT_001e4d20,auVar6);
  this->MouseDownDurationPrev[0] = (float)auVar5._0_4_;
  this->MouseDownDurationPrev[1] = (float)auVar5._4_4_;
  this->MouseDownDurationPrev[2] = (float)auVar5._8_4_;
  this->MouseDownDurationPrev[3] = (float)auVar5._12_4_;
  this->MouseDownDurationPrev[4] = (float)auVar5._16_4_;
  this->MouseDragMaxDistanceAbs[0].x = (float)(int)auVar5._20_8_;
  this->MouseDragMaxDistanceAbs[0].y = (float)(int)((ulong)auVar5._20_8_ >> 0x20);
  this->MouseDragMaxDistanceAbs[1].x = (float)auVar5._28_4_;
  auVar5 = vmaskmovps_avx(auVar2,auVar6);
  this->MouseDownDuration[0] = (float)auVar5._0_4_;
  this->MouseDownDuration[1] = (float)auVar5._4_4_;
  this->MouseDownDuration[2] = (float)auVar5._8_4_;
  this->MouseDownDuration[3] = (float)auVar5._12_4_;
  this->MouseDownDuration[4] = (float)auVar5._16_4_;
  this->MouseDownDurationPrev[0] = (float)auVar5._20_4_;
  this->MouseDownDurationPrev[1] = (float)auVar5._24_4_;
  this->MouseDownDurationPrev[2] = (float)auVar5._28_4_;
  lVar4 = -0x200;
  do {
    *(undefined1 (*) [32])(this->NavInputsDownDuration + lVar4) = auVar6;
    *(undefined1 (*) [32])(this->KeysDownDurationPrev + lVar4) = auVar6;
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0);
  lVar4 = 0;
  auVar5 = vpmovsxbq_avx2(ZEXT416(0x3020100));
  auVar2 = vpmovsxbq_avx2(ZEXT416(0x7060504));
  auVar7._8_8_ = 0x8000000000000000;
  auVar7._0_8_ = 0x8000000000000000;
  auVar7._16_8_ = 0x8000000000000000;
  auVar7._24_8_ = 0x8000000000000000;
  auVar8._8_8_ = 0x8000000000000015;
  auVar8._0_8_ = 0x8000000000000015;
  auVar8._16_8_ = 0x8000000000000015;
  auVar8._24_8_ = 0x8000000000000015;
  do {
    auVar9._8_8_ = lVar4;
    auVar9._0_8_ = lVar4;
    auVar9._16_8_ = lVar4;
    auVar9._24_8_ = lVar4;
    auVar3 = vpor_avx2(auVar9,auVar5);
    auVar9 = vpor_avx2(auVar9,auVar2);
    auVar9 = vpcmpgtq_avx2(auVar8,auVar9 ^ auVar7);
    auVar3 = vpcmpgtq_avx2(auVar8,auVar3 ^ auVar7);
    auVar9 = vpackssdw_avx2(auVar3,auVar9);
    auVar1 = vpackssdw_avx(auVar9._0_16_,auVar9._16_16_);
    auVar1 = vpshufd_avx(auVar1,0xd8);
    auVar9 = vpmovzxwd_avx2(auVar1);
    auVar9 = vpslld_avx2(auVar9,0x1f);
    auVar9 = vmaskmovps_avx(auVar9,auVar6);
    *(undefined1 (*) [32])(this->NavInputsDownDuration + lVar4) = auVar9;
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x18);
  return;
}

Assistant:

ImGuiIO::ImGuiIO()
{
    // Most fields are initialized with zero
    memset(this, 0, sizeof(*this));
    IM_ASSERT(IM_ARRAYSIZE(ImGuiIO::MouseDown) == ImGuiMouseButton_COUNT && IM_ARRAYSIZE(ImGuiIO::MouseClicked) == ImGuiMouseButton_COUNT); // Our pre-C++11 IM_STATIC_ASSERT() macros triggers warning on modern compilers so we don't use it here.

    // Settings
    ConfigFlags = ImGuiConfigFlags_None;
    BackendFlags = ImGuiBackendFlags_None;
    DisplaySize = ImVec2(-1.0f, -1.0f);
    DeltaTime = 1.0f / 60.0f;
    IniSavingRate = 5.0f;
    IniFilename = "imgui.ini";
    LogFilename = "imgui_log.txt";
    MouseDoubleClickTime = 0.30f;
    MouseDoubleClickMaxDist = 6.0f;
    for (int i = 0; i < ImGuiKey_COUNT; i++)
        KeyMap[i] = -1;
    KeyRepeatDelay = 0.275f;
    KeyRepeatRate = 0.050f;
    UserData = NULL;

    Fonts = NULL;
    FontGlobalScale = 1.0f;
    FontDefault = NULL;
    FontAllowUserScaling = false;
    DisplayFramebufferScale = ImVec2(1.0f, 1.0f);

    // Miscellaneous options
    MouseDrawCursor = false;
#ifdef __APPLE__
    ConfigMacOSXBehaviors = true;  // Set Mac OS X style defaults based on __APPLE__ compile time flag
#else
    ConfigMacOSXBehaviors = false;
#endif
    ConfigInputTextCursorBlink = true;
    ConfigWindowsResizeFromEdges = true;
    ConfigWindowsMoveFromTitleBarOnly = false;
    ConfigMemoryCompactTimer = 60.0f;

    // Platform Functions
    BackendPlatformName = BackendRendererName = NULL;
    BackendPlatformUserData = BackendRendererUserData = BackendLanguageUserData = NULL;
    GetClipboardTextFn = GetClipboardTextFn_DefaultImpl;   // Platform dependent default implementations
    SetClipboardTextFn = SetClipboardTextFn_DefaultImpl;
    ClipboardUserData = NULL;
    ImeSetInputScreenPosFn = ImeSetInputScreenPosFn_DefaultImpl;
    ImeWindowHandle = NULL;

    // Input (NB: we already have memset zero the entire structure!)
    MousePos = ImVec2(-FLT_MAX, -FLT_MAX);
    MousePosPrev = ImVec2(-FLT_MAX, -FLT_MAX);
    MouseDragThreshold = 6.0f;
    for (int i = 0; i < IM_ARRAYSIZE(MouseDownDuration); i++) MouseDownDuration[i] = MouseDownDurationPrev[i] = -1.0f;
    for (int i = 0; i < IM_ARRAYSIZE(KeysDownDuration); i++) KeysDownDuration[i]  = KeysDownDurationPrev[i] = -1.0f;
    for (int i = 0; i < IM_ARRAYSIZE(NavInputsDownDuration); i++) NavInputsDownDuration[i] = -1.0f;
}